

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_functions.cpp
# Opt level: O2

ScalarFunctionSet * duckdb::ArrayCosineDistanceFun::GetFunctions(void)

{
  vector<duckdb::ScalarFunction,_true> *this;
  LogicalType varargs;
  LogicalType varargs_00;
  NotImplementedException *this_00;
  ScalarFunctionSet *in_RDI;
  long lVar1;
  pointer child;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  undefined4 in_stack_fffffffffffffbe4;
  undefined4 in_stack_fffffffffffffbec;
  FunctionNullHandling in_stack_fffffffffffffbf8;
  ScalarFunctionSet *bind_lambda;
  code *local_3f0 [2];
  code *local_3e0;
  code *local_3d8;
  LogicalType *local_3d0;
  LogicalType local_3c8;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_398;
  LogicalType local_380;
  LogicalType array;
  string local_350;
  undefined1 local_330 [296];
  ScalarFunction function;
  BaseScalarFunction local_e0;
  
  ::std::__cxx11::string::string
            ((string *)&local_350,"array_cosine_distance",(allocator *)&function);
  ScalarFunctionSet::ScalarFunctionSet(in_RDI,&local_350);
  ::std::__cxx11::string::~string((string *)&local_350);
  LogicalType::Real();
  local_3d0 = local_398.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  this = &(in_RDI->super_FunctionSet<duckdb::ScalarFunction>).functions;
  child = local_398.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          _M_impl.super__Vector_impl_data._M_start;
  bind_lambda = in_RDI;
  do {
    if (child == local_3d0) {
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_398);
      return in_RDI;
    }
    LogicalType::ARRAY(&array,child,(optional_idx)0xffffffffffffffff);
    if (child->id_ == DOUBLE) {
      LogicalType::LogicalType((LogicalType *)local_330,&array);
      LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&array);
      __l_00._M_len = 2;
      __l_00._M_array = (iterator)local_330;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3b0,__l_00,(allocator_type *)&local_e0);
      LogicalType::LogicalType(&local_3c8,child);
      local_3f0[1] = (code *)0x0;
      local_3f0[0] = ArrayGenericFold<double,duckdb::CosineDistanceOp>;
      local_3d8 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_3e0 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      LogicalType::LogicalType(&local_380,INVALID);
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs_00._0_8_ = &local_380;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffbe4;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs_00.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffbec;
      ScalarFunction::ScalarFunction
                (&function,(vector<duckdb::LogicalType,_true> *)&local_3b0,&local_3c8,
                 (scalar_function_t *)local_3f0,ArrayGenericBinaryBind,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs_00,CONSISTENT,in_stack_fffffffffffffbf8,
                 (bind_lambda_function_t)bind_lambda);
      LogicalType::~LogicalType(&local_380);
      ::std::_Function_base::~_Function_base((_Function_base *)local_3f0);
      LogicalType::~LogicalType(&local_3c8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b0);
      lVar1 = 0x18;
      in_RDI = bind_lambda;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      BaseScalarFunction::SetReturnsError(&local_e0,&function.super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      ScalarFunction::ScalarFunction((ScalarFunction *)local_330,&function);
      bind_lambda = in_RDI;
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 (ScalarFunction *)local_330);
    }
    else {
      if (child->id_ != FLOAT) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&function,"Array function not implemented for type %s",
                   (allocator *)&local_e0);
        LogicalType::ToString_abi_cxx11_((string *)local_330,child);
        NotImplementedException::NotImplementedException<std::__cxx11::string>
                  (this_00,(string *)&function,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_330);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      LogicalType::LogicalType((LogicalType *)local_330,&array);
      LogicalType::LogicalType((LogicalType *)(local_330 + 0x18),&array);
      __l._M_len = 2;
      __l._M_array = (iterator)local_330;
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                (&local_3b0,__l,(allocator_type *)&local_e0);
      LogicalType::LogicalType(&local_3c8,child);
      local_3f0[1] = (code *)0x0;
      local_3f0[0] = ArrayGenericFold<float,duckdb::CosineDistanceOp>;
      local_3d8 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_invoke;
      local_3e0 = ::std::
                  _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
                  ::_M_manager;
      LogicalType::LogicalType(&local_380,INVALID);
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ = 0;
      varargs._0_8_ = &local_380;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_ =
           in_stack_fffffffffffffbe4;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_4_
           = 0;
      varargs.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           = in_stack_fffffffffffffbec;
      ScalarFunction::ScalarFunction
                (&function,(vector<duckdb::LogicalType,_true> *)&local_3b0,&local_3c8,
                 (scalar_function_t *)local_3f0,ArrayGenericBinaryBind,
                 (bind_scalar_function_extended_t)0x0,(function_statistics_t)0x0,
                 (init_local_state_t)0x0,varargs,CONSISTENT,in_stack_fffffffffffffbf8,
                 (bind_lambda_function_t)bind_lambda);
      LogicalType::~LogicalType(&local_380);
      ::std::_Function_base::~_Function_base((_Function_base *)local_3f0);
      LogicalType::~LogicalType(&local_3c8);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3b0);
      lVar1 = 0x18;
      in_RDI = bind_lambda;
      do {
        LogicalType::~LogicalType((LogicalType *)(local_330 + lVar1));
        lVar1 = lVar1 + -0x18;
      } while (lVar1 != -0x18);
      BaseScalarFunction::SetReturnsError(&local_e0,&function.super_BaseScalarFunction);
      BaseScalarFunction::~BaseScalarFunction(&local_e0);
      ScalarFunction::ScalarFunction((ScalarFunction *)local_330,&function);
      bind_lambda = in_RDI;
      ::std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
      emplace_back<duckdb::ScalarFunction>
                (&this->
                  super_vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>,
                 (ScalarFunction *)local_330);
    }
    ScalarFunction::~ScalarFunction((ScalarFunction *)local_330);
    ScalarFunction::~ScalarFunction(&function);
    LogicalType::~LogicalType(&array);
    child = child + 1;
  } while( true );
}

Assistant:

ScalarFunctionSet ArrayCosineDistanceFun::GetFunctions() {
	ScalarFunctionSet set("array_cosine_distance");
	for (auto &type : LogicalType::Real()) {
		AddArrayFoldFunction<CosineDistanceOp>(set, type);
	}
	return set;
}